

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

bool __thiscall
Lib::DHMap<SAT::SATLiteral,_Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
          (DHMap<SAT::SATLiteral,_Kernel::Literal_*,_Lib::DefaultHash,_Lib::DefaultHash2> *this,
          SATLiteral key,Literal *val)

{
  uint uVar1;
  Entry *pEVar2;
  uint uVar3;
  uint uVar4;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 local_14;
  
  local_14 = key.field_0;
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  pEVar2 = findEntryToInsert(this,(SATLiteral *)&local_14.field_1);
  uVar4 = (uint)(pEVar2->field_0)._infoData >> 2;
  uVar1 = this->_timestamp;
  uVar3 = (pEVar2->field_0)._infoData & 1;
  if (uVar4 != uVar1 || uVar3 != 0) {
    if (uVar4 == uVar1) {
      this->_deleted = this->_deleted + -1;
    }
    else {
      (pEVar2->field_0)._infoData = uVar3 + uVar1 * 4;
    }
    *(byte *)&pEVar2->field_0 = *(byte *)&pEVar2->field_0 & 0xfe;
    (pEVar2->_key).field_0.field_1 =
         (anon_struct_4_2_b3f3f878_for_anon_union_4_2_6ac8864f_for_SATLiteral_0_1)local_14;
    pEVar2->_val = val;
    this->_size = this->_size + 1;
  }
  return uVar4 != uVar1 || uVar3 != 0;
}

Assistant:

bool insert(Key key, Val val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key = std::move(key);
      e->_val = std::move(val);
      _size++;
    }
    return !exists;

  }